

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall wabt::Module::AppendFields(Module *this,ModuleFieldList *fields)

{
  long *local_20;
  
  while (*(long *)(fields + 0x10) != 0) {
    intrusive_list<wabt::ModuleField>::extract_front((intrusive_list<wabt::ModuleField> *)&local_20)
    ;
    AppendField(this,(unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)
                     &local_20);
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
    local_20 = (long *)0x0;
  }
  return;
}

Assistant:

void Module::AppendFields(ModuleFieldList* fields) {
  while (!fields->empty())
    AppendField(std::unique_ptr<ModuleField>(fields->extract_front()));
}